

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

value_type * __thiscall
QList<QRingChunk>::takeFirst(value_type *__return_storage_ptr__,QList<QRingChunk> *this)

{
  iterator iVar1;
  
  __return_storage_ptr__->tailOffset = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->chunk).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  __return_storage_ptr__->headOffset = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->chunk).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->chunk).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  iVar1 = begin(this);
  QRingChunk::QRingChunk(__return_storage_ptr__,iVar1.i);
  QtPrivate::QGenericArrayOps<QRingChunk>::eraseFirst((QGenericArrayOps<QRingChunk> *)this);
  return __return_storage_ptr__;
}

Assistant:

value_type takeFirst() { Q_ASSERT(!isEmpty()); value_type v = std::move(first()); d->eraseFirst(); return v; }